

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

SmallVectorImpl<unsigned_long> * __thiscall
llvm::SmallVectorImpl<unsigned_long>::operator=
          (SmallVectorImpl<unsigned_long> *this,SmallVectorImpl<unsigned_long> *RHS)

{
  bool bVar1;
  iterator puVar2;
  iterator puVar3;
  iterator MinSize;
  iterator puVar4;
  iterator puVar5;
  unsigned_long *local_38;
  iterator NewEnd;
  size_t CurSize;
  size_t RHSSize;
  SmallVectorImpl<unsigned_long> *RHS_local;
  SmallVectorImpl<unsigned_long> *this_local;
  
  if (this != RHS) {
    bVar1 = SmallVectorTemplateCommon<unsigned_long,_void>::isSmall
                      ((SmallVectorTemplateCommon<unsigned_long,_void> *)RHS);
    if (bVar1) {
      MinSize = (iterator)SmallVectorBase::size((SmallVectorBase *)RHS);
      NewEnd = (iterator)SmallVectorBase::size((SmallVectorBase *)this);
      if (NewEnd < MinSize) {
        puVar4 = (iterator)SmallVectorBase::capacity((SmallVectorBase *)this);
        if (puVar4 < MinSize) {
          puVar2 = SmallVectorTemplateCommon<unsigned_long,_void>::begin
                             ((SmallVectorTemplateCommon<unsigned_long,_void> *)this);
          puVar3 = SmallVectorTemplateCommon<unsigned_long,_void>::end
                             ((SmallVectorTemplateCommon<unsigned_long,_void> *)this);
          SmallVectorTemplateBase<unsigned_long,_true>::destroy_range(puVar2,puVar3);
          SmallVectorBase::set_size((SmallVectorBase *)this,0);
          NewEnd = (iterator)0x0;
          SmallVectorTemplateBase<unsigned_long,_true>::grow
                    (&this->super_SmallVectorTemplateBase<unsigned_long,_true>,(size_t)MinSize);
        }
        else if (NewEnd != (iterator)0x0) {
          puVar2 = SmallVectorTemplateCommon<unsigned_long,_void>::begin
                             ((SmallVectorTemplateCommon<unsigned_long,_void> *)RHS);
          puVar3 = SmallVectorTemplateCommon<unsigned_long,_void>::begin
                             ((SmallVectorTemplateCommon<unsigned_long,_void> *)RHS);
          puVar5 = SmallVectorTemplateCommon<unsigned_long,_void>::begin
                             ((SmallVectorTemplateCommon<unsigned_long,_void> *)this);
          std::move<unsigned_long*,unsigned_long*>(puVar2,puVar3 + (long)NewEnd,puVar5);
        }
        puVar2 = SmallVectorTemplateCommon<unsigned_long,_void>::begin
                           ((SmallVectorTemplateCommon<unsigned_long,_void> *)RHS);
        puVar3 = SmallVectorTemplateCommon<unsigned_long,_void>::end
                           ((SmallVectorTemplateCommon<unsigned_long,_void> *)RHS);
        puVar5 = SmallVectorTemplateCommon<unsigned_long,_void>::begin
                           ((SmallVectorTemplateCommon<unsigned_long,_void> *)this);
        SmallVectorTemplateBase<unsigned_long,true>::
        uninitialized_move<unsigned_long*,unsigned_long*>
                  (puVar2 + (long)NewEnd,puVar3,puVar5 + (long)NewEnd);
        SmallVectorBase::set_size((SmallVectorBase *)this,(size_t)MinSize);
        clear(RHS);
      }
      else {
        local_38 = SmallVectorTemplateCommon<unsigned_long,_void>::begin
                             ((SmallVectorTemplateCommon<unsigned_long,_void> *)this);
        if (MinSize != (iterator)0x0) {
          puVar2 = SmallVectorTemplateCommon<unsigned_long,_void>::begin
                             ((SmallVectorTemplateCommon<unsigned_long,_void> *)RHS);
          puVar3 = SmallVectorTemplateCommon<unsigned_long,_void>::end
                             ((SmallVectorTemplateCommon<unsigned_long,_void> *)RHS);
          local_38 = std::move<unsigned_long*,unsigned_long*>(puVar2,puVar3,local_38);
        }
        puVar2 = SmallVectorTemplateCommon<unsigned_long,_void>::end
                           ((SmallVectorTemplateCommon<unsigned_long,_void> *)this);
        SmallVectorTemplateBase<unsigned_long,_true>::destroy_range(local_38,puVar2);
        SmallVectorBase::set_size((SmallVectorBase *)this,(size_t)MinSize);
        clear(RHS);
      }
    }
    else {
      puVar2 = SmallVectorTemplateCommon<unsigned_long,_void>::begin
                         ((SmallVectorTemplateCommon<unsigned_long,_void> *)this);
      puVar3 = SmallVectorTemplateCommon<unsigned_long,_void>::end
                         ((SmallVectorTemplateCommon<unsigned_long,_void> *)this);
      SmallVectorTemplateBase<unsigned_long,_true>::destroy_range(puVar2,puVar3);
      bVar1 = SmallVectorTemplateCommon<unsigned_long,_void>::isSmall
                        ((SmallVectorTemplateCommon<unsigned_long,_void> *)this);
      if (!bVar1) {
        puVar2 = SmallVectorTemplateCommon<unsigned_long,_void>::begin
                           ((SmallVectorTemplateCommon<unsigned_long,_void> *)this);
        free(puVar2);
      }
      (this->super_SmallVectorTemplateBase<unsigned_long,_true>).
      super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.BeginX =
           (RHS->super_SmallVectorTemplateBase<unsigned_long,_true>).
           super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.BeginX;
      (this->super_SmallVectorTemplateBase<unsigned_long,_true>).
      super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Size =
           (RHS->super_SmallVectorTemplateBase<unsigned_long,_true>).
           super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Size;
      (this->super_SmallVectorTemplateBase<unsigned_long,_true>).
      super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Capacity =
           (RHS->super_SmallVectorTemplateBase<unsigned_long,_true>).
           super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Capacity;
      SmallVectorTemplateCommon<unsigned_long,_void>::resetToSmall
                ((SmallVectorTemplateCommon<unsigned_long,_void> *)RHS);
    }
  }
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::operator=(SmallVectorImpl<T> &&RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If the RHS isn't small, clear this vector and then steal its buffer.
  if (!RHS.isSmall()) {
    this->destroy_range(this->begin(), this->end());
    if (!this->isSmall()) free(this->begin());
    this->BeginX = RHS.BeginX;
    this->Size = RHS.Size;
    this->Capacity = RHS.Capacity;
    RHS.resetToSmall();
    return *this;
  }

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd = this->begin();
    if (RHSSize)
      NewEnd = std::move(RHS.begin(), RHS.end(), NewEnd);

    // Destroy excess elements and trim the bounds.
    this->destroy_range(NewEnd, this->end());
    this->set_size(RHSSize);

    // Clear the RHS.
    RHS.clear();

    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: this may not actually make any sense if we can efficiently move
  // elements.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->set_size(0);
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::move(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Move-construct the new elements in place.
  this->uninitialized_move(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->set_size(RHSSize);

  RHS.clear();
  return *this;
}